

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqbaselib.cpp
# Opt level: O0

SQInteger string_slice(HSQUIRRELVM v)

{
  SQInteger this;
  SQInteger SVar1;
  SQString *x;
  SQObjectPtr local_60;
  long local_50;
  SQInteger slen;
  undefined1 local_38 [8];
  SQObjectPtr o;
  SQInteger eidx;
  SQInteger sidx;
  HSQUIRRELVM v_local;
  
  sidx = (SQInteger)v;
  SQObjectPtr::SQObjectPtr((SQObjectPtr *)local_38);
  SVar1 = get_slice_params((HSQUIRRELVM)sidx,&eidx,&o.super_SQObject._unVal.nInteger,
                           (SQObjectPtr *)local_38);
  this = sidx;
  if (SVar1 < 0) {
    v_local = (HSQUIRRELVM)0xffffffffffffffff;
  }
  else {
    local_50 = *(long *)(o.super_SQObject._0_8_ + 0x28);
    if (eidx < 0) {
      eidx = local_50 + eidx;
    }
    if (o.super_SQObject._unVal.nInteger < 0) {
      o.super_SQObject._unVal.pTable =
           (SQTable *)
           ((long)&((o.super_SQObject._unVal.pTable)->super_SQDelegable).super_SQCollectable.
                   super_SQRefCounted._vptr_SQRefCounted + local_50);
    }
    if ((long)o.super_SQObject._unVal < eidx) {
      v_local = (HSQUIRRELVM)sq_throwerror((HSQUIRRELVM)sidx,"wrong indexes");
    }
    else if ((local_50 < o.super_SQObject._unVal.nInteger) || (eidx < 0)) {
      v_local = (HSQUIRRELVM)sq_throwerror((HSQUIRRELVM)sidx,"slice out of range");
    }
    else {
      x = SQString::Create(*(SQSharedState **)(sidx + 0x118),
                           (SQChar *)(o.super_SQObject._0_8_ + 0x38 + eidx),
                           (long)o.super_SQObject._unVal.pTable - eidx);
      SQObjectPtr::SQObjectPtr(&local_60,x);
      SQVM::Push((SQVM *)this,&local_60);
      SQObjectPtr::~SQObjectPtr(&local_60);
      v_local = (HSQUIRRELVM)0x1;
    }
  }
  slen._0_4_ = 1;
  SQObjectPtr::~SQObjectPtr((SQObjectPtr *)local_38);
  return (SQInteger)v_local;
}

Assistant:

static SQInteger string_slice(HSQUIRRELVM v)
{
    SQInteger sidx,eidx;
    SQObjectPtr o;
    if(SQ_FAILED(get_slice_params(v,sidx,eidx,o)))return -1;
    SQInteger slen = _string(o)->_len;
    if(sidx < 0)sidx = slen + sidx;
    if(eidx < 0)eidx = slen + eidx;
    if(eidx < sidx) return sq_throwerror(v,_SC("wrong indexes"));
    if(eidx > slen || sidx < 0) return sq_throwerror(v, _SC("slice out of range"));
    v->Push(SQString::Create(_ss(v),&_stringval(o)[sidx],eidx-sidx));
    return 1;
}